

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

DoWhileStatementSyntax * __thiscall
slang::parsing::Parser::parseDoWhileStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token doKeyword_00;
  Token closeParen_00;
  Token semi_00;
  DoWhileStatementSyntax *pDVar1;
  Info *in_RDI;
  Token TVar2;
  Token TVar3;
  Token TVar4;
  Token openParen_00;
  Token whileKeyword_00;
  Token semi;
  Token closeParen;
  ExpressionSyntax *expr;
  Token openParen;
  Token whileKeyword;
  StatementSyntax *statement;
  Token doKeyword;
  undefined1 in_stack_000009a6;
  undefined1 in_stack_000009a7;
  Parser *in_stack_000009a8;
  Parser *in_stack_fffffffffffffe70;
  pointer in_stack_fffffffffffffe78;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe80;
  ParserBase *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffeb0;
  TokenKind in_stack_fffffffffffffefe;
  ParserBase *in_stack_ffffffffffffff00;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_48;
  
  TVar2 = ParserBase::consume(in_stack_fffffffffffffe90);
  parseStatement(in_stack_000009a8,(bool)in_stack_000009a7,(bool)in_stack_000009a6);
  TVar3 = ParserBase::expect(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
  TVar4 = ParserBase::expect(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
  parseExpression(in_stack_fffffffffffffe70);
  openParen_00 = ParserBase::expect(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
  whileKeyword_00 = ParserBase::expect(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe80._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffe78;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe70,
             elements);
  local_48 = TVar2._0_8_;
  local_60 = TVar3._0_8_;
  local_58 = TVar3.info;
  local_70 = TVar4._0_8_;
  local_68 = TVar4.info;
  local_88 = openParen_00._0_8_;
  local_80 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)openParen_00.info;
  local_98 = whileKeyword_00._0_8_;
  local_90 = whileKeyword_00.info;
  doKeyword_00.info = in_RDI;
  doKeyword_00.kind = (short)in_stack_fffffffffffffeb0;
  doKeyword_00._2_1_ = (char)((ulong)in_stack_fffffffffffffeb0 >> 0x10);
  doKeyword_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffeb0 >> 0x18);
  doKeyword_00.rawLen = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  closeParen_00.info = local_60;
  closeParen_00._0_8_ = local_68;
  semi_00.info = local_48;
  semi_00._0_8_ = local_58;
  pDVar1 = slang::syntax::SyntaxFactory::doWhileStatement
                     ((SyntaxFactory *)local_90,local_98,local_80,doKeyword_00,local_88,
                      whileKeyword_00,openParen_00,local_70,closeParen_00,semi_00);
  return pDVar1;
}

Assistant:

DoWhileStatementSyntax& Parser::parseDoWhileStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto doKeyword = consume();
    auto& statement = parseStatement();
    auto whileKeyword = expect(TokenKind::WhileKeyword);
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto semi = expect(TokenKind::Semicolon);
    return factory.doWhileStatement(label, attributes, doKeyword, statement, whileKeyword,
                                    openParen, expr, closeParen, semi);
}